

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::deinit
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  pointer p_Var1;
  TessellationShaderUtils *this_00;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  pointer p_Var5;
  long lVar4;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0x4e8))(0x8c89);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glDisable(GL_RASTERIZER_DISCARD) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x30e);
    (**(code **)(lVar4 + 0x4e8))(0x8d69);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glDisable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x311);
    (**(code **)(lVar4 + 0x40))(0x8c8e,0);
    (**(code **)(lVar4 + 0x48))(0x8c8e,0,0);
    (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)(lVar4 + 0xd8))(0);
    if (this->m_bo_id != 0) {
      (**(code **)(lVar4 + 0x438))(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_fs_id != 0) {
      (**(code **)(lVar4 + 0x470))();
      this->m_fs_id = 0;
    }
    if (this->m_vs_id != 0) {
      (**(code **)(lVar4 + 0x470))();
      this->m_vs_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    for (p_Var5 = (this->m_runs).
                  super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var1 = (this->m_runs).
                 super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                 ._M_impl.super__Vector_impl_data._M_finish, p_Var5 != p_Var1; p_Var5 = p_Var5 + 1)
    {
      deinitRun(this,p_Var5);
    }
    p_Var5 = (this->m_runs).
             super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var1 != p_Var5) {
      (this->m_runs).
      super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
      ._M_impl.super__Vector_impl_data._M_finish = p_Var5;
    }
    this_00 = this->m_utils_ptr;
    if (this_00 != (TessellationShaderUtils *)0x0) {
      TessellationShaderUtils::~TessellationShaderUtils(this_00);
      operator_delete(this_00,0x20);
      this->m_utils_ptr = (TessellationShaderUtils *)0x0;
    }
  }
  return;
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::deinit()
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Disable modes this test has enabled */
	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) failed");

	gl.disable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed");

	/* Remove TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Restore GL_PATCH_VERTICES_EXT value */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Free all ES objects we allocated for the test */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Deinitialize all run descriptors */
	for (_runs::iterator it = m_runs.begin(); it != m_runs.end(); ++it)
	{
		deinitRun(*it);
	}
	m_runs.clear();

	/* Release tessellation shader test utilities instance */
	if (m_utils_ptr != NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = NULL;
	}
}